

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l2_norm(default_cost_type<double> *this,int n)

{
  double *pdVar1;
  int i;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (n == 0) {
    dVar4 = 0.0;
  }
  else {
    auVar5 = ZEXT816(0);
    uVar2 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->linear_elements)._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar2];
      auVar5 = vfmadd231sd_fma(auVar5,auVar6,auVar6);
      dVar4 = auVar5._0_8_;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  dVar3 = ABS(dVar4);
  if ((n != 0 && (ulong)dVar3 < 0x7ff0000000000001) &&
      (0xffffffffffffe < (long)dVar3 - 1U && (dVar4 != 0.0 && dVar3 != INFINITY))) {
    pdVar1 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    uVar2 = 0;
    do {
      pdVar1[uVar2] = pdVar1[uVar2] / dVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }